

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O3

Array<capnp::word> * __thiscall
capnp::messageToFlatArray
          (Array<capnp::word> *__return_storage_ptr__,capnp *this,
          ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments)

{
  size_t elementCount;
  word *pwVar1;
  capnp *pcVar2;
  uint uVar3;
  ArrayPtr<const_capnp::word> *pAVar4;
  void *__dest;
  ArrayPtr<const_capnp::word> *segment;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  
  segments_00.size_ = segments.ptr;
  segments_00.ptr = segments_00.size_;
  elementCount = computeSerializedSizeInWords(this,segments_00);
  pwVar1 = (word *)kj::_::HeapArrayDisposer::allocateImpl
                             (8,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                              (_func_void_void_ptr *)0x0);
  *(int *)&pwVar1->content = (int)segments.ptr + -1;
  if (segments_00.size_ == (ArrayPtr<const_capnp::word> *)0x0) {
    *(undefined4 *)((long)&pwVar1->content + 4) = 0;
  }
  else {
    pcVar2 = this + 8;
    uVar3 = 1;
    do {
      pAVar4 = (ArrayPtr<const_capnp::word> *)(ulong)uVar3;
      *(undefined4 *)((long)&pwVar1->content + (long)pAVar4 * 4) = *(undefined4 *)pcVar2;
      pcVar2 = pcVar2 + 0x10;
      uVar3 = uVar3 + 1;
    } while (pAVar4 < segments_00.size_);
    if (((undefined1  [16])segments & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      *(undefined4 *)((long)&pwVar1->content + (long)&(segments_00.size_)->ptr * 4 + 4) = 0;
    }
    pcVar2 = this + (long)segments_00.size_ * 0x10;
    __dest = (void *)((long)&pwVar1[1].content + ((ulong)segments_00.size_ & 0xfffffffffffffffe) * 4
                     );
    do {
      memcpy(__dest,*(void **)this,*(long *)(this + 8) << 3);
      __dest = (void *)((long)__dest + *(long *)(this + 8) * 8);
      this = this + 0x10;
    } while (this != pcVar2);
  }
  __return_storage_ptr__->ptr = pwVar1;
  __return_storage_ptr__->size_ = elementCount;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  return __return_storage_ptr__;
}

Assistant:

kj::Array<word> messageToFlatArray(kj::ArrayPtr<const kj::ArrayPtr<const word>> segments) {
  kj::Array<word> result = kj::heapArray<word>(computeSerializedSizeInWords(segments));

  _::WireValue<uint32_t>* table =
      reinterpret_cast<_::WireValue<uint32_t>*>(result.begin());

  // We write the segment count - 1 because this makes the first word zero for single-segment
  // messages, improving compression.  We don't bother doing this with segment sizes because
  // one-word segments are rare anyway.
  table[0].set(segments.size() - 1);

  for (uint i = 0; i < segments.size(); i++) {
    table[i + 1].set(segments[i].size());
  }

  if (segments.size() % 2 == 0) {
    // Set padding byte.
    table[segments.size() + 1].set(0);
  }

  word* dst = result.begin() + segments.size() / 2 + 1;

  for (auto& segment: segments) {
    memcpy(dst, segment.begin(), segment.size() * sizeof(word));
    dst += segment.size();
  }

  KJ_DASSERT(dst == result.end(), "Buffer overrun/underrun bug in code above.");

  return kj::mv(result);
}